

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

void __thiscall Snes_Spc::cpu_write_smp_reg_(Snes_Spc *this,int data,rel_time_t time,int addr)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t (*pauVar9) [16];
  int iVar10;
  Snes_Spc *this_00;
  int i;
  long lVar11;
  int iVar12;
  uint uVar13;
  Timer *pTVar14;
  
  switch(addr) {
  case 1:
    if ((data & 0x10U) != 0) {
      pauVar9 = (this->m).smp_regs;
      *(uint8_t *)((long)(pauVar9 + 1) + 4) = '\0';
      *(uint8_t *)((long)(pauVar9 + 1) + 5) = '\0';
    }
    if ((data & 0x20U) != 0) {
      pauVar9 = (this->m).smp_regs;
      *(uint8_t *)((long)(pauVar9 + 1) + 6) = '\0';
      *(uint8_t *)((long)(pauVar9 + 1) + 7) = '\0';
    }
    pTVar14 = (this->m).timers;
    lVar11 = 0;
    this_00 = this;
    do {
      uVar13 = (uint)(((uint)data >> ((uint)lVar11 & 0x1f) & 1) != 0);
      if (pTVar14->enabled != uVar13) {
        if (pTVar14->next_time <= time) {
          run_timer_(this_00,pTVar14,time);
        }
        pTVar14->enabled = uVar13;
        if (uVar13 != 0) {
          pTVar14->divider = 0;
          pTVar14->counter = 0;
        }
      }
      lVar11 = lVar11 + 1;
      pTVar14 = pTVar14 + 1;
    } while (lVar11 != 3);
    uVar13 = data & 0x80;
    if ((this->m).rom_enabled != uVar13) {
      (this->m).rom_enabled = uVar13;
      lVar11 = 0x924;
      if (uVar13 != 0) {
        uVar2 = *(undefined8 *)((this->m).ram.ram + 0xffc0);
        uVar3 = *(undefined8 *)((this->m).ram.ram + 0xffc8);
        uVar4 = *(undefined8 *)((this->m).ram.ram + 0xffd0);
        uVar5 = *(undefined8 *)((this->m).ram.ram + 0xffd8);
        uVar6 = *(undefined8 *)((this->m).ram.ram + 0xffe0);
        uVar7 = *(undefined8 *)((this->m).ram.ram + 0xffe8);
        uVar8 = *(undefined8 *)((this->m).ram.ram + 0xfff8);
        *(undefined8 *)((this->m).hi_ram + 0x30) = *(undefined8 *)((this->m).ram.ram + 0xfff0);
        *(undefined8 *)((this->m).hi_ram + 0x38) = uVar8;
        *(undefined8 *)((this->m).hi_ram + 0x20) = uVar6;
        *(undefined8 *)((this->m).hi_ram + 0x28) = uVar7;
        *(undefined8 *)((this->m).hi_ram + 0x10) = uVar4;
        *(undefined8 *)((this->m).hi_ram + 0x18) = uVar5;
        *(undefined8 *)(this->m).hi_ram = uVar2;
        *(undefined8 *)((this->m).hi_ram + 8) = uVar3;
        lVar11 = 0x8e4;
      }
      puVar1 = (this->dsp).m.regs + lVar11;
      uVar2 = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (this->dsp).m.regs + lVar11 + 0x10;
      uVar4 = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (this->dsp).m.regs + lVar11 + 0x20;
      uVar6 = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (this->dsp).m.regs + lVar11 + 0x30;
      uVar8 = *(undefined8 *)(puVar1 + 8);
      *(undefined8 *)((this->m).ram.ram + 0xfff0) = *(undefined8 *)puVar1;
      *(undefined8 *)((this->m).ram.ram + 0xfff8) = uVar8;
      *(undefined8 *)((this->m).ram.ram + 0xffe0) = uVar6;
      *(undefined8 *)((this->m).ram.ram + 0xffe8) = uVar7;
      *(undefined8 *)((this->m).ram.ram + 0xffd0) = uVar4;
      *(undefined8 *)((this->m).ram.ram + 0xffd8) = uVar5;
      *(undefined8 *)((this->m).ram.ram + 0xffc0) = uVar2;
      *(undefined8 *)((this->m).ram.ram + 0xffc8) = uVar3;
    }
    break;
  case 8:
  case 9:
    (this->m).smp_regs[1][addr] = (uint8_t)data;
    break;
  case 10:
  case 0xb:
  case 0xc:
    iVar10 = addr + -10;
    iVar12 = (data - 1U & 0xff) + 1;
    if ((this->m).timers[iVar10].period != iVar12) {
      pTVar14 = (this->m).timers + iVar10;
      if (pTVar14->next_time <= time) {
        run_timer_(this,pTVar14,time);
      }
      (this->m).timers[iVar10].period = iVar12;
    }
    break;
  case 0xd:
  case 0xe:
  case 0xf:
    if (data < 0x1000) {
      pTVar14 = (this->m).timers + (addr + -0xd);
      if (pTVar14->next_time < time) {
        run_timer_(this,pTVar14,time + -1);
      }
      (this->m).timers[addr + -0xd].counter = 0;
    }
  }
  return;
}

Assistant:

void Snes_Spc::cpu_write_smp_reg_( int data, rel_time_t time, int addr )
{
	switch ( addr )
	{
	case r_t0target:
	case r_t1target:
	case r_t2target: {
		Timer* t = &m.timers [addr - r_t0target];
		int period = IF_0_THEN_256( data );
		if ( t->period != period )
		{
			t = run_timer( t, time );
			#if SPC_MORE_ACCURACY
				// Insane behavior when target is written just after counter is
				// clocked and counter matches new period and new period isn't 1, 2, 4, or 8
				if ( t->divider == (period & 0xFF) &&
						t->next_time == time + TIMER_MUL( t, 1 ) &&
						((period - 1) | ~0x0F) & period )
				{
					//debug_printf( "SPC pathological timer target write\n" );
					
					// If the period is 3, 5, or 9, there's a probability this behavior won't occur,
					// based on the previous period
					int prob = 0xFF;
					int old_period = t->period & 0xFF;
					if ( period == 3 ) prob = glitch_probs [0] [old_period];
					if ( period == 5 ) prob = glitch_probs [1] [old_period];
					if ( period == 9 ) prob = glitch_probs [2] [old_period];
					
					// The glitch suppresses incrementing of one of the counter bits, based on
					// the lowest set bit in the new period
					int b = 1;
					while ( !(period & b) )
						b <<= 1;
					
					if ( (rand() >> 4 & 0xFF) <= prob )
						t->divider = (t->divider - b) & 0xFF;
				}
			#endif
			t->period = period;
		}
		break;
	}
	
	case r_t0out:
	case r_t1out:
	case r_t2out:
		if ( !SPC_MORE_ACCURACY )
			debug_printf( "SPC wrote to counter %d\n", (int) addr - r_t0out );
		
		if ( data < no_read_before_write  / 2 )
			run_timer( &m.timers [addr - r_t0out], time - 1 )->counter = 0;
		break;
	
	// Registers that act like RAM
	case 0x8:
	case 0x9:
		REGS_IN [addr] = (uint8_t) data;
		break;
	
	case r_test:
		if ( (uint8_t) data != 0x0A )
			debug_printf( "SPC wrote to test register\n" );
		break;
	
	case r_control:
		// port clears
		if ( data & 0x10 )
		{
			REGS_IN [r_cpuio0] = 0;
			REGS_IN [r_cpuio1] = 0;
		}
		if ( data & 0x20 )
		{
			REGS_IN [r_cpuio2] = 0;
			REGS_IN [r_cpuio3] = 0;
		}
		
		// timers
		{
			for ( int i = 0; i < timer_count; i++ )
			{
				Timer* t = &m.timers [i];
				int enabled = data >> i & 1;
				if ( t->enabled != enabled )
				{
					t = run_timer( t, time );
					t->enabled = enabled;
					if ( enabled )
					{
						t->divider = 0;
						t->counter = 0;
					}
				}
			}
		}
		enable_rom( data & 0x80 );
		break;
	}
}